

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

void Aig_Support_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  uint uVar4;
  
  iVar1 = p->nTravIds;
  if (pObj->TravId != iVar1) {
    while( true ) {
      pObj->TravId = iVar1;
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar4 = uVar2 & 7;
      if (uVar4 == 1) {
        return;
      }
      if (uVar4 == 2) break;
      if ((uVar4 != 4) && (1 < (uVar2 & 7) - 5)) {
        __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                      ,0x33d,"void Aig_Support_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      Aig_Support_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      if (pObj == (Aig_Obj_t *)0x0) {
        return;
      }
      iVar1 = p->nTravIds;
      if (pObj->TravId == iVar1) {
        return;
      }
    }
    uVar2 = vSupp->nSize;
    if (uVar2 == vSupp->nCap) {
      if ((int)uVar2 < 0x10) {
        if (vSupp->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vSupp->pArray,0x80);
        }
        vSupp->pArray = ppvVar3;
        vSupp->nCap = 0x10;
      }
      else {
        if (vSupp->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vSupp->pArray,(ulong)uVar2 << 4);
        }
        vSupp->pArray = ppvVar3;
        vSupp->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar3 = vSupp->pArray;
    }
    iVar1 = vSupp->nSize;
    vSupp->nSize = iVar1 + 1;
    ppvVar3[iVar1] = pObj;
  }
  return;
}

Assistant:

void Aig_Support_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_Support_rec( p, Aig_ObjFanin0(pObj), vSupp );
    if ( Aig_ObjFanin1(pObj) )
        Aig_Support_rec( p, Aig_ObjFanin1(pObj), vSupp );
}